

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>,kj::_::PromiseDisposer,kj::List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>&>
          (PromiseDisposer *this,
          List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,_&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>
          *params)

{
  Maybe<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode_&> *pMVar1;
  void *pvVar2;
  
  pvVar2 = operator_new(0x400);
  *(undefined8 *)((long)pvVar2 + 0x208) = 0;
  *(undefined ***)((long)pvVar2 + 0x1f8) = &PTR_destroy_00628958;
  *(undefined ***)((long)pvVar2 + 0x210) = &PTR_reject_006289a8;
  *(undefined1 *)((long)pvVar2 + 0x218) = 0;
  *(undefined1 *)((long)pvVar2 + 0x3b0) = 0;
  *(undefined1 *)((long)pvVar2 + 0x3d8) = 1;
  *(long *)((long)pvVar2 + 0x3e0) = (long)pvVar2 + 0x210;
  *(undefined8 *)((long)pvVar2 + 1000) = 0;
  *(List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,_&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>
    **)((long)pvVar2 + 0x3f8) = params;
  pMVar1 = params->tail;
  pMVar1->ptr = (BaseNode *)((long)pvVar2 + 0x3e0);
  *(Maybe<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode_&> **)((long)pvVar2 + 0x3f0) = pMVar1;
  params->tail = (Maybe<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode_&> *)
                 ((long)pvVar2 + 1000);
  params->listSize = params->listSize + 1;
  *(void **)((long)pvVar2 + 0x200) = pvVar2;
  *(long *)this = (long)pvVar2 + 0x1f8;
  return (Own<kj::_::AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }